

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O2

char ** glfwGetRequiredInstanceExtensions(uint32_t *count)

{
  GLFWbool GVar1;
  char **ppcVar2;
  
  if (count != (uint32_t *)0x0) {
    *count = 0;
    if (_glfw.initialized == 0) {
      ppcVar2 = (char **)0x0;
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      GVar1 = _glfwInitVulkan(2);
      ppcVar2 = (char **)0x0;
      if ((GVar1 != 0) && (_glfw.vk.extensions[0] != (char *)0x0)) {
        *count = 2;
        ppcVar2 = _glfw.vk.extensions;
      }
    }
    return ppcVar2;
  }
  __assert_fail("count != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/vulkan.c"
                ,0xe6,"const char **glfwGetRequiredInstanceExtensions(uint32_t *)");
}

Assistant:

GLFWAPI const char** glfwGetRequiredInstanceExtensions(uint32_t* count)
{
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!_glfwInitVulkan(_GLFW_REQUIRE_LOADER))
        return NULL;

    if (!_glfw.vk.extensions[0])
        return NULL;

    *count = 2;
    return (const char**) _glfw.vk.extensions;
}